

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

NameSet * wasm::BranchUtils::getBranchTargets(NameSet *__return_storage_ptr__,Expression *ast)

{
  undefined1 auStack_128 [8];
  Scanner scanner;
  Expression *local_18;
  Expression *ast_local;
  
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&scanner.targets;
  auStack_128 = (undefined1  [8])0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.fixed._M_elems[9].
  currp = (Expression **)0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currFunction =
       (Function *)0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
  super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.targets._M_t._M_impl._0_4_ = 0;
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       scanner.targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_18 = ast;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk
            ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)auStack_128,
             &local_18);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&scanner.super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.
                 super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.currModule);
  getBranchTargets::Scanner::~Scanner((Scanner *)auStack_128);
  return __return_storage_ptr__;
}

Assistant:

inline NameSet getBranchTargets(Expression* ast) {
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    NameSet targets;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          targets.insert(name);
        }
      });
    }
  };
  Scanner scanner;
  scanner.walk(ast);
  return scanner.targets;
}